

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * ODDLParser::OpenDDLParser::parseReference
                 (char *in,char *end,
                 vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *names)

{
  pointer *pppNVar1;
  iterator iVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *pvVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  undefined1 auVar10 [16];
  Name *nextName;
  Name *local_40;
  undefined1 local_38 [16];
  
  if (in != end && in != (char *)0x0) {
    local_40 = (Name *)0x0;
    pvVar6 = (vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)in;
    in = parseName(in,end,&local_40);
    if (local_40 != (Name *)0x0) {
      iVar2._M_current =
           (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        pvVar6 = names;
        std::vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>>::
        _M_realloc_insert<ODDLParser::Name*const&>
                  ((vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>> *)names,iVar2,
                   &local_40);
      }
      else {
        *iVar2._M_current = local_40;
        pppNVar1 = &(names->
                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
    }
    if (*(char *)&(((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)in)->
                  super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
                  _M_impl.super__Vector_impl_data._M_start == ',') {
      bVar3 = 0x2c;
      local_38._4_8_ = 0x7b7b7b7b09090909;
      local_38._0_4_ = 0x20202020;
      local_38._12_4_ = 0;
      do {
        while( true ) {
          auVar10 = pshuflw(ZEXT216(CONCAT11(bVar3,bVar3)),ZEXT216(CONCAT11(bVar3,bVar3)),0);
          bVar7 = (bVar3 & 0xfe) == 0x28;
          cVar13 = auVar10[3];
          cVar12 = auVar10[2];
          cVar11 = auVar10[1];
          cVar9 = auVar10[0];
          auVar10[0] = -(cVar9 == local_38[0]);
          auVar10[1] = -(cVar9 == local_38[1]);
          auVar10[2] = -(cVar9 == local_38[2]);
          auVar10[3] = -(cVar9 == local_38[3]);
          auVar10[4] = -(cVar11 == local_38[4]);
          auVar10[5] = -(cVar11 == local_38[5]);
          auVar10[6] = -(cVar11 == local_38[6]);
          auVar10[7] = -(cVar11 == local_38[7]);
          auVar10[8] = -(cVar12 == local_38[8]);
          auVar10[9] = -(cVar12 == local_38[9]);
          auVar10[10] = -(cVar12 == local_38[10]);
          auVar10[0xb] = -(cVar12 == local_38[0xb]);
          auVar10[0xc] = -(cVar13 == local_38[0xc]);
          auVar10[0xd] = -(cVar13 == local_38[0xd]);
          auVar10[0xe] = -(cVar13 == local_38[0xe]);
          auVar10[0xf] = -(cVar13 == local_38[0xf]);
          iVar5 = movmskps((int)pvVar6,auVar10);
          bVar8 = iVar5 != 0;
          bVar4 = bVar8;
          if ((in != end) &&
             (bVar4 = bVar8 || (bVar3 == 0x5b || (bVar7 || bVar3 == 0x2c)),
             bVar8 || (bVar3 == 0x5b || (bVar7 || bVar3 == 0x2c)))) break;
          pvVar6 = (vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)
                   (ulong)CONCAT31((int3)((uint)iVar5 >> 8),bVar4);
          bVar3 = *(byte *)((long)&(((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                      *)in)->
                                   super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1);
          in = (char *)((long)&(((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)
                                in)->
                               super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1);
        }
        if (bVar3 != 0x2c) {
          return (char *)(vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)in;
        }
        pvVar6 = (vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)in;
        in = parseName(in,end,&local_40);
        if (local_40 != (Name *)0x0) {
          iVar2._M_current =
               (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            pvVar6 = names;
            std::vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>>::
            _M_realloc_insert<ODDLParser::Name*const&>
                      ((vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>> *)names,iVar2,
                       &local_40);
          }
          else {
            *iVar2._M_current = local_40;
            pppNVar1 = &(names->
                        super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>)
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppNVar1 = *pppNVar1 + 1;
          }
        }
        bVar3 = 0x2c;
      } while (*(char *)&(((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)in)->
                         super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                         )._M_impl.super__Vector_impl_data._M_start == ',');
    }
  }
  return (char *)(vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)in;
}

Assistant:

char *OpenDDLParser::parseReference( char *in, char *end, std::vector<Name*> &names ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    Name *nextName( ddl_nullptr );
    in = parseName( in, end, &nextName );
    if( nextName ) {
        names.push_back( nextName );
    }
    while( Grammar::CommaSeparator[ 0 ] == *in ) {
        in = getNextSeparator( in, end );
        if( Grammar::CommaSeparator[ 0 ] == *in ) {
            in = parseName( in, end, &nextName );
            if( nextName ) {
                names.push_back( nextName );
            }
        } else {
            break;
        }
    }

    return in;
}